

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataParser.cpp
# Opt level: O3

void __thiscall firmata::FirmataParser::processSysexMessage(FirmataParser *this)

{
  uint8_t uVar1;
  byte bVar2;
  uint8_t *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar3 = this->dataBuffer;
  uVar1 = *puVar3;
  if (uVar1 != 'q') {
    if (uVar1 != 'y') {
      if (this->currentSysexCallback == (sysexCallbackFunction)0x0) {
        return;
      }
      (*this->currentSysexCallback)
                (this->currentSysexCallbackContext,uVar1,this->sysexBytesRead - 1,puVar3 + 1);
      return;
    }
    if (this->currentReportFirmwareCallback == (versionCallbackFunction)0x0) {
      return;
    }
    uVar5 = this->sysexBytesRead;
    if (uVar5 < 3) {
      (*this->currentReportFirmwareCallback)
                (this->currentReportFirmwareCallbackContext,0,0,(char *)0x0);
      return;
    }
    uVar6 = 3;
    if (uVar5 != 3) {
      uVar6 = uVar5 - 4 >> 1;
      lVar4 = 0;
      do {
        bVar2 = puVar3[lVar4 * 2 + 3];
        puVar3[lVar4 + 3] = bVar2;
        puVar3[lVar4 + 3] = puVar3[lVar4 * 2 + 4] << 7 | bVar2;
        lVar4 = lVar4 + 1;
      } while (uVar6 + 1 != lVar4);
      uVar6 = uVar6 + 4;
    }
    if (this->dataBufferSize <= uVar6) {
      if (this->currentDataBufferOverflowCallback == (dataBufferOverflowCallbackFunction)0x0)
      goto LAB_0010ce82;
      this->allowBufferUpdate = true;
      (*this->currentDataBufferOverflowCallback)(this->currentDataBufferOverflowCallbackContext);
      if (this->dataBufferSize <= uVar6) goto LAB_0010ce82;
    }
    this->dataBuffer[uVar6] = '\0';
LAB_0010ce82:
    puVar3 = this->dataBuffer;
    (*this->currentReportFirmwareCallback)
              (this->currentReportFirmwareCallbackContext,(size_t)puVar3[1],(size_t)puVar3[2],
               (char *)(puVar3 + 3));
    return;
  }
  if (this->currentStringCallback == (stringCallbackFunction)0x0) {
    return;
  }
  uVar5 = 1;
  if (this->sysexBytesRead != 1) {
    uVar5 = this->sysexBytesRead - 2 >> 1;
    lVar4 = 0;
    do {
      bVar2 = puVar3[lVar4 * 2 + 1];
      puVar3[lVar4 + 1] = bVar2;
      puVar3[lVar4 + 1] = puVar3[lVar4 * 2 + 2] << 7 | bVar2;
      lVar4 = lVar4 + 1;
    } while (uVar5 + 1 != lVar4);
    uVar5 = uVar5 + 2;
  }
  if (this->dataBufferSize <= uVar5) {
    if (this->currentDataBufferOverflowCallback == (dataBufferOverflowCallbackFunction)0x0)
    goto LAB_0010cdc5;
    this->allowBufferUpdate = true;
    (*this->currentDataBufferOverflowCallback)(this->currentDataBufferOverflowCallbackContext);
    if (this->dataBufferSize <= uVar5) goto LAB_0010cdc5;
  }
  this->dataBuffer[uVar5] = '\0';
LAB_0010cdc5:
  (*this->currentStringCallback)(this->currentStringCallbackContext,(char *)(this->dataBuffer + 1));
  return;
}

Assistant:

void FirmataParser::processSysexMessage(void)
{
  switch (dataBuffer[0]) { //first byte in buffer is command
    case REPORT_FIRMWARE:
      if (currentReportFirmwareCallback) {
        const size_t major_version_offset = 1;
        const size_t minor_version_offset = 2;
        const size_t string_offset = 3;
        // Test for malformed REPORT_FIRMWARE message (used to query firmware prior to Firmata v3.0.0)
        if ( 3 > sysexBytesRead ) {
          (*currentReportFirmwareCallback)(currentReportFirmwareCallbackContext, 0, 0, (const char *)NULL);
        } else {
          const size_t end_of_string = (string_offset + decodeByteStream((sysexBytesRead - string_offset), &dataBuffer[string_offset]));
          bufferDataAtPosition('\0', end_of_string); // NULL terminate the string
          (*currentReportFirmwareCallback)(currentReportFirmwareCallbackContext, (size_t)dataBuffer[major_version_offset], (size_t)dataBuffer[minor_version_offset], (const char *)&dataBuffer[string_offset]);
        }
      }
      break;
    case STRING_DATA:
      if (currentStringCallback) {
        const size_t string_offset = 1;
        const size_t end_of_string = (string_offset + decodeByteStream((sysexBytesRead - string_offset), &dataBuffer[string_offset]));
        bufferDataAtPosition('\0', end_of_string); // NULL terminate the string
        (*currentStringCallback)(currentStringCallbackContext, (const char *)&dataBuffer[string_offset]);
      }
      break;
    default:
      if (currentSysexCallback)
        (*currentSysexCallback)(currentSysexCallbackContext, dataBuffer[0], sysexBytesRead - 1, dataBuffer + 1);
  }
}